

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_attr_get_(MPIABI_Fint *comm,MPIABI_Fint *comm_keyval,void *attribute_val,int *flag,
                     MPIABI_Fint *ierror)

{
  mpi_attr_get_();
  return;
}

Assistant:

void mpiabi_attr_get_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * comm_keyval,
  void * attribute_val,
  int * flag,
  MPIABI_Fint * ierror
) {
  return mpi_attr_get_(
    comm,
    comm_keyval,
    attribute_val,
    flag,
    ierror
  );
}